

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS1::setGyroCTRL3(RTIMULSM9DS1 *this)

{
  uchar ctrl3;
  RTIMULSM9DS1 *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_LSM9DS1GyroHpf < 0) ||
     (9 < ((this->super_RTIMU).m_settings)->m_LSM9DS1GyroHpf)) {
    fprintf(_stderr,"Illegal LSM9DS1 gyro high pass filter code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS1GyroHpf);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelGyroSlaveAddr,'\x12',
                            (byte)((this->super_RTIMU).m_settings)->m_LSM9DS1GyroHpf | 0x40,
                            "Failed to set LSM9DS1 gyro CTRL3");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMULSM9DS1::setGyroCTRL3()
{
    unsigned char ctrl3;

    if ((m_settings->m_LSM9DS1GyroHpf < LSM9DS1_GYRO_HPF_0) || (m_settings->m_LSM9DS1GyroHpf > LSM9DS1_GYRO_HPF_9)) {
        HAL_ERROR1("Illegal LSM9DS1 gyro high pass filter code %d\n", m_settings->m_LSM9DS1GyroHpf);
        return false;
    }
    ctrl3 = m_settings->m_LSM9DS1GyroHpf;

    //  Turn on hpf
    ctrl3 |= 0x40;

    return m_settings->HALWrite(m_accelGyroSlaveAddr,  LSM9DS1_CTRL3, ctrl3, "Failed to set LSM9DS1 gyro CTRL3");
}